

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.h
# Opt level: O3

Shape * __thiscall Shape::addPolygon(Shape *this,Polygon *p)

{
  Polygon *pPVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  Polygon *pPVar10;
  long lVar11;
  
  iVar2 = this->size;
  uVar9 = (ulong)(iVar2 + 1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9;
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x50),8) == 0) {
    uVar8 = SUB168(auVar3 * ZEXT816(0x50),0) | 8;
  }
  puVar5 = (ulong *)operator_new__(uVar8);
  pPVar1 = (Polygon *)(puVar5 + 1);
  *puVar5 = uVar9;
  iVar4 = -1;
  if (iVar2 != -1) {
    lVar7 = 0;
    pPVar10 = pPVar1;
    do {
      Polygon::Polygon(pPVar10);
      lVar7 = lVar7 + -0x50;
      pPVar10 = pPVar10 + 0x50;
    } while (-lVar7 != uVar9 * 0x50);
    iVar4 = this->size;
    if (0 < iVar4) {
      lVar11 = 0;
      lVar7 = 0;
      do {
        Polygon::operator=(pPVar1 + lVar11,this->polygons + lVar11);
        lVar7 = lVar7 + 1;
        iVar4 = this->size;
        lVar6 = (long)iVar4;
        lVar11 = lVar11 + 0x50;
      } while (lVar7 < lVar6);
      goto LAB_00104858;
    }
  }
  lVar6 = (long)iVar4;
LAB_00104858:
  this->size = iVar4 + 1;
  Polygon::operator=(pPVar1 + lVar6 * 0x50,p);
  pPVar10 = this->polygons;
  if (pPVar10 != (Polygon *)0x0) {
    if (*(long *)(pPVar10 + -8) != 0) {
      lVar7 = *(long *)(pPVar10 + -8) * 0x50;
      do {
        Polygon::~Polygon(pPVar10 + lVar7 + -0x50);
        lVar7 = lVar7 + -0x50;
      } while (lVar7 != 0);
    }
    operator_delete__(pPVar10 + -8);
  }
  this->polygons = pPVar1;
  return this;
}

Assistant:

Shape& addPolygon(const Polygon& p) {
    Polygon* newPolygons = new Polygon[size + 1];
    for(int i = 0; i < size; i++) {
      newPolygons[i] = polygons[i];
    }
    newPolygons[size++] = p;
    if (polygons != NULL) delete[] polygons;
    polygons = newPolygons;

    return *this;
  }